

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::collect_stale_iterators(Database *this)

{
  pointer pbVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *this_00;
  bool bVar2;
  uint64_t uVar3;
  time_t tVar4;
  _Base_ptr p_Var5;
  mapped_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *itername;
  key_type *__k;
  _Rb_tree_node_base *p_Var6;
  string_view iterator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iterator_drop_list;
  IteratorLock lock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *local_98;
  _Rb_tree_node_base *local_90;
  IteratorLock local_88;
  ConfigKey local_68;
  
  ConfigKey::iterator_gc_seconds();
  uVar3 = DatabaseConfig::get(&this->config_,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (uVar3 != 0) {
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tVar4 = time((time_t *)0x0);
    local_98 = &this->iterators;
    p_Var6 = &(this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = p_Var6;
    for (p_Var5 = (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        this_00 = local_98,
        pbVar1 = local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        __k = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start, p_Var5 != p_Var6;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if (uVar3 < (ulong)(tVar4 - (long)p_Var5[0xc]._M_right)) {
        iterator._M_str = *(char **)(p_Var5 + 1);
        iterator._M_len = (size_t)p_Var5[1]._M_parent;
        IteratorLock::IteratorLock(&local_88,iterator);
        std::__detail::__variant::_Variant_storage<false,DatasetLock,IteratorLock>::
        _Variant_storage<1ul,IteratorLock&>
                  ((_Variant_storage<false,DatasetLock,IteratorLock> *)&local_68,&local_88);
        bVar2 = can_acquire(this,(DatabaseLock *)&local_68);
        std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::
        ~_Variant_storage((_Variant_storage<false,_DatasetLock,_IteratorLock> *)&local_68);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_b8,(value_type *)(p_Var5 + 1));
        }
        std::__cxx11::string::~string((string *)&local_88);
        p_Var6 = local_90;
      }
    }
    for (; __k != pbVar1; __k = __k + 1) {
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
                ::at(this_00,__k);
      OnDiskIterator::drop(this_01);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
      ::erase(&this_00->_M_t,__k);
    }
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      save(this);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
  }
  return;
}

Assistant:

void Database::collect_stale_iterators() {
    uint64_t iterator_gc_seconds =
        config_.get(ConfigKey::iterator_gc_seconds());
    if (iterator_gc_seconds == 0) {
        // Zero means that GC is disabled.
        return;
    }

    std::vector<std::string> iterator_drop_list;
    std::time_t now = std::time(nullptr);
    for (const auto &[itername, iter] : iterators) {
        if (now - iter.get_last_read_time() > iterator_gc_seconds) {
            auto lock = IteratorLock(itername);
            if (can_acquire(lock)) {
                // Iterator is not locked, so it's unused, so we can free it.
                // Yes, in theory this is a race condition. But we can't acquire
                // a new lock here since we don't know the task, and chance of
                // this happening is extremely slim (iterator would have to be
                // used in exactly right millisecond after days of inactivity).
                iterator_drop_list.push_back(itername);
            }
        }
    }

    for (const auto &itername : iterator_drop_list) {
        iterators.at(itername).drop();
        iterators.erase(itername);
    }

    if (!iterator_drop_list.empty()) {
        save();
    }
}